

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O3

void __thiscall
icu_63::Normalizer2Impl::makeCanonIterDataFromNorm16
          (Normalizer2Impl *this,UChar32 start,UChar32 end,uint16_t norm16,CanonIterData *newData,
          UErrorCode *errorCode)

{
  ushort uVar1;
  uint16_t *puVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  undefined6 in_register_0000000a;
  ulong uVar7;
  ushort uVar8;
  uint uVar9;
  int c;
  uint uVar10;
  uint uVar11;
  uint32_t value;
  bool bVar12;
  
  uVar6 = (uint)CONCAT62(in_register_0000000a,norm16);
  if ((uVar6 != 1) && (start <= end && (this->minNoNo <= norm16 || norm16 < this->minYesNo))) {
    do {
      uVar4 = umutablecptrie_get_63(newData->mutableTrie,start);
      if (norm16 < this->minMaybeYes) {
        uVar8 = this->minYesNo;
        if (norm16 < uVar8) {
          value = uVar4 | 0x40000000;
          goto LAB_00299a9a;
        }
        c = start;
        uVar10 = uVar6;
        if (this->limitNoNo <= norm16) {
          c = ((uint)(norm16 >> 3) + start) - (uint)this->centerNoNoDelta;
          uVar3 = getRawNorm16(this,c);
          uVar10 = (uint)uVar3;
          uVar8 = this->minYesNo;
        }
        if (uVar8 < (ushort)uVar10) {
          puVar2 = this->extraData;
          uVar7 = (ulong)(uVar10 & 0xfffe);
          uVar8 = *(ushort *)((long)puVar2 + uVar7);
          value = uVar4;
          if (((start == c) && ((uVar8 & 0x80) != 0)) &&
             (value = uVar4 | 0x80000000, *(char *)((long)puVar2 + (uVar7 - 2)) == '\0')) {
            value = uVar4;
          }
          if ((uVar8 & 0x1f) != 0) {
            uVar1 = *(ushort *)((long)puVar2 + uVar7 + 2);
            uVar9 = (uint)uVar1;
            uVar11 = 1;
            if ((uVar9 & 0xfc00) == 0xd800) {
              uVar9 = (uint)uVar1 * 0x400 + (uint)*(ushort *)((long)puVar2 + uVar7 + 4) + 0xfca02400
              ;
              uVar11 = 2;
            }
            CanonIterData::addToStartSet(newData,start,uVar9,errorCode);
            if ((this->minNoNo <= (ushort)uVar10) && (uVar11 < (uVar8 & 0x1f))) {
              do {
                uVar1 = *(ushort *)((long)puVar2 + (long)(int)uVar11 * 2 + uVar7 + 2);
                uVar9 = (uint)uVar1;
                uVar10 = uVar11 + 1;
                if ((uVar9 & 0xfc00) == 0xd800) {
                  uVar9 = (uint)uVar1 * 0x400 +
                          (uint)*(ushort *)((long)puVar2 + (long)(int)(uVar11 + 1) * 2 + uVar7 + 2)
                          + 0xfca02400;
                  uVar10 = uVar11 + 2;
                }
                uVar11 = uVar10;
                uVar5 = umutablecptrie_get_63(newData->mutableTrie,uVar9);
                if (-1 < (int)uVar5) {
                  umutablecptrie_set_63(newData->mutableTrie,uVar9,uVar5 | 0x80000000,errorCode);
                }
              } while ((int)uVar11 < (int)(uVar8 & 0x1f));
            }
          }
          goto LAB_00299a9a;
        }
        CanonIterData::addToStartSet(newData,start,c,errorCode);
      }
      else {
        value = uVar4 | (norm16 < 0xfc00 | 0xfffffffe) << 0x1e;
LAB_00299a9a:
        if (value != uVar4) {
          umutablecptrie_set_63(newData->mutableTrie,start,value,errorCode);
        }
      }
      bVar12 = start != end;
      start = start + 1;
    } while (bVar12);
  }
  return;
}

Assistant:

void Normalizer2Impl::makeCanonIterDataFromNorm16(UChar32 start, UChar32 end, const uint16_t norm16,
                                                  CanonIterData &newData,
                                                  UErrorCode &errorCode) const {
    if(isInert(norm16) || (minYesNo<=norm16 && norm16<minNoNo)) {
        // Inert, or 2-way mapping (including Hangul syllable).
        // We do not write a canonStartSet for any yesNo character.
        // Composites from 2-way mappings are added at runtime from the
        // starter's compositions list, and the other characters in
        // 2-way mappings get CANON_NOT_SEGMENT_STARTER set because they are
        // "maybe" characters.
        return;
    }
    for(UChar32 c=start; c<=end; ++c) {
        uint32_t oldValue = umutablecptrie_get(newData.mutableTrie, c);
        uint32_t newValue=oldValue;
        if(isMaybeOrNonZeroCC(norm16)) {
            // not a segment starter if it occurs in a decomposition or has cc!=0
            newValue|=CANON_NOT_SEGMENT_STARTER;
            if(norm16<MIN_NORMAL_MAYBE_YES) {
                newValue|=CANON_HAS_COMPOSITIONS;
            }
        } else if(norm16<minYesNo) {
            newValue|=CANON_HAS_COMPOSITIONS;
        } else {
            // c has a one-way decomposition
            UChar32 c2=c;
            // Do not modify the whole-range norm16 value.
            uint16_t norm16_2=norm16;
            if (isDecompNoAlgorithmic(norm16_2)) {
                // Maps to an isCompYesAndZeroCC.
                c2 = mapAlgorithmic(c2, norm16_2);
                norm16_2 = getRawNorm16(c2);
                // No compatibility mappings for the CanonicalIterator.
                U_ASSERT(!(isHangulLV(norm16_2) || isHangulLVT(norm16_2)));
            }
            if (norm16_2 > minYesNo) {
                // c decomposes, get everything from the variable-length extra data
                const uint16_t *mapping=getMapping(norm16_2);
                uint16_t firstUnit=*mapping;
                int32_t length=firstUnit&MAPPING_LENGTH_MASK;
                if((firstUnit&MAPPING_HAS_CCC_LCCC_WORD)!=0) {
                    if(c==c2 && (*(mapping-1)&0xff)!=0) {
                        newValue|=CANON_NOT_SEGMENT_STARTER;  // original c has cc!=0
                    }
                }
                // Skip empty mappings (no characters in the decomposition).
                if(length!=0) {
                    ++mapping;  // skip over the firstUnit
                    // add c to first code point's start set
                    int32_t i=0;
                    U16_NEXT_UNSAFE(mapping, i, c2);
                    newData.addToStartSet(c, c2, errorCode);
                    // Set CANON_NOT_SEGMENT_STARTER for each remaining code point of a
                    // one-way mapping. A 2-way mapping is possible here after
                    // intermediate algorithmic mapping.
                    if(norm16_2>=minNoNo) {
                        while(i<length) {
                            U16_NEXT_UNSAFE(mapping, i, c2);
                            uint32_t c2Value = umutablecptrie_get(newData.mutableTrie, c2);
                            if((c2Value&CANON_NOT_SEGMENT_STARTER)==0) {
                                umutablecptrie_set(newData.mutableTrie, c2,
                                                   c2Value|CANON_NOT_SEGMENT_STARTER, &errorCode);
                            }
                        }
                    }
                }
            } else {
                // c decomposed to c2 algorithmically; c has cc==0
                newData.addToStartSet(c, c2, errorCode);
            }
        }
        if(newValue!=oldValue) {
            umutablecptrie_set(newData.mutableTrie, c, newValue, &errorCode);
        }
    }
}